

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cws.c
# Opt level: O3

void nn_cws_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  int *self_00;
  ushort uVar1;
  void *addrlen;
  int iVar2;
  size_t addrlen_00;
  char *pcVar3;
  char *host;
  long lVar4;
  int extraout_EDX;
  void **ppvVar5;
  sockaddr *psVar6;
  nn_ep *pnVar7;
  byte bVar8;
  int val;
  int ipv4only;
  size_t locallen;
  sockaddr_storage local;
  undefined1 local_140 [4];
  int local_13c;
  size_t local_138;
  size_t local_130;
  sockaddr_storage local_128;
  sockaddr local_a8 [8];
  
  bVar8 = 0;
  switch(*(undefined4 *)&self[1].fn) {
  case 1:
    if (src == -2) {
      if (type == -2) {
LAB_00137f02:
        nn_cws_start_resolving((nn_cws *)self);
        return;
      }
      src = type;
      nn_cws_handler_cold_22();
      type = extraout_EDX;
      goto switchD_00137b2b_caseD_5;
    }
LAB_00137fba:
    nn_cws_handler_cold_21();
LAB_00137fbf:
    nn_cws_handler_cold_19();
LAB_00137fc4:
    nn_cws_handler_cold_7();
LAB_00137fc9:
    nn_cws_handler_cold_5();
LAB_00137fce:
    nn_cws_handler_cold_1();
    break;
  case 2:
    if (src != 3) goto LAB_00137fbf;
    if (type == 1) {
      nn_dns_stop((nn_dns *)&self[0x52].stopped.item);
      *(undefined4 *)&self[1].fn = 3;
      return;
    }
    goto LAB_00137fe1;
  case 3:
    if (src != 3) goto LAB_00137fab;
    if (type == 2) {
      if (self[0x57].state != 0) {
LAB_00137ecc:
        nn_backoff_start((nn_backoff *)&self[8].shutdown_fn);
        *(undefined4 *)&self[1].fn = 8;
        return;
      }
      addrlen = self[0x58].stopped.srcptr;
      local_128.ss_family = 0;
      local_128.__ss_padding[0] = '\0';
      local_128.__ss_padding[1] = '\0';
      local_128.__ss_padding[2] = '\0';
      local_128.__ss_padding[3] = '\0';
      local_128.__ss_padding[4] = '\0';
      local_128.__ss_padding[5] = '\0';
      local_128.__ss_padding[6] = '\0';
      local_128.__ss_padding[7] = '\0';
      local_128.__ss_padding[8] = '\0';
      local_128.__ss_padding[9] = '\0';
      local_128.__ss_padding[10] = '\0';
      local_128.__ss_padding[0xb] = '\0';
      local_128.__ss_padding[0xc] = '\0';
      local_128.__ss_padding[0xd] = '\0';
      local_128.__ss_padding[0xe] = '\0';
      local_128.__ss_padding[0xf] = '\0';
      local_128.__ss_padding[0x10] = '\0';
      local_128.__ss_padding[0x11] = '\0';
      local_128.__ss_padding[0x12] = '\0';
      local_128.__ss_padding[0x13] = '\0';
      local_128.__ss_padding[0x14] = '\0';
      local_128.__ss_padding[0x15] = '\0';
      local_128.__ss_padding[0x16] = '\0';
      local_128.__ss_padding[0x17] = '\0';
      local_128.__ss_padding[0x18] = '\0';
      local_128.__ss_padding[0x19] = '\0';
      local_128.__ss_padding[0x1a] = '\0';
      local_128.__ss_padding[0x1b] = '\0';
      local_128.__ss_padding[0x1c] = '\0';
      local_128.__ss_padding[0x1d] = '\0';
      local_128.__ss_padding[0x1e] = '\0';
      local_128.__ss_padding[0x1f] = '\0';
      local_128.__ss_padding[0x20] = '\0';
      local_128.__ss_padding[0x21] = '\0';
      local_128.__ss_padding[0x22] = '\0';
      local_128.__ss_padding[0x23] = '\0';
      local_128.__ss_padding[0x24] = '\0';
      local_128.__ss_padding[0x25] = '\0';
      local_128.__ss_padding[0x26] = '\0';
      local_128.__ss_padding[0x27] = '\0';
      local_128.__ss_padding[0x28] = '\0';
      local_128.__ss_padding[0x29] = '\0';
      local_128.__ss_padding[0x2a] = '\0';
      local_128.__ss_padding[0x2b] = '\0';
      local_128.__ss_padding[0x2c] = '\0';
      local_128.__ss_padding[0x2d] = '\0';
      local_128.__ss_padding[0x2e] = '\0';
      local_128.__ss_padding[0x2f] = '\0';
      local_128.__ss_padding[0x30] = '\0';
      local_128.__ss_padding[0x31] = '\0';
      local_128.__ss_padding[0x32] = '\0';
      local_128.__ss_padding[0x33] = '\0';
      local_128.__ss_padding[0x34] = '\0';
      local_128.__ss_padding[0x35] = '\0';
      local_128.__ss_padding[0x36] = '\0';
      local_128.__ss_padding[0x37] = '\0';
      local_128.__ss_padding[0x38] = '\0';
      local_128.__ss_padding[0x39] = '\0';
      local_128.__ss_padding[0x3a] = '\0';
      local_128.__ss_padding[0x3b] = '\0';
      local_128.__ss_padding[0x3c] = '\0';
      local_128.__ss_padding[0x3d] = '\0';
      local_128.__ss_padding[0x3e] = '\0';
      local_128.__ss_padding[0x3f] = '\0';
      local_128.__ss_padding[0x40] = '\0';
      local_128.__ss_padding[0x41] = '\0';
      local_128.__ss_padding[0x42] = '\0';
      local_128.__ss_padding[0x43] = '\0';
      local_128.__ss_padding[0x44] = '\0';
      local_128.__ss_padding[0x45] = '\0';
      local_128.__ss_padding[0x46] = '\0';
      local_128.__ss_padding[0x47] = '\0';
      local_128.__ss_padding[0x48] = '\0';
      local_128.__ss_padding[0x49] = '\0';
      local_128.__ss_padding[0x4a] = '\0';
      local_128.__ss_padding[0x4b] = '\0';
      local_128.__ss_padding[0x4c] = '\0';
      local_128.__ss_padding[0x4d] = '\0';
      local_128.__ss_padding[0x4e] = '\0';
      local_128.__ss_padding[0x4f] = '\0';
      local_128.__ss_padding[0x50] = '\0';
      local_128.__ss_padding[0x51] = '\0';
      local_128.__ss_padding[0x52] = '\0';
      local_128.__ss_padding[0x53] = '\0';
      local_128.__ss_padding[0x54] = '\0';
      local_128.__ss_padding[0x55] = '\0';
      local_128.__ss_padding[0x56] = '\0';
      local_128.__ss_padding[0x57] = '\0';
      local_128.__ss_padding[0x58] = '\0';
      local_128.__ss_padding[0x59] = '\0';
      local_128.__ss_padding[0x5a] = '\0';
      local_128.__ss_padding[0x5b] = '\0';
      local_128.__ss_padding[0x5c] = '\0';
      local_128.__ss_padding[0x5d] = '\0';
      local_128.__ss_padding[0x5e] = '\0';
      local_128.__ss_padding[0x5f] = '\0';
      local_128.__ss_padding[0x60] = '\0';
      local_128.__ss_padding[0x61] = '\0';
      local_128.__ss_padding[0x62] = '\0';
      local_128.__ss_padding[99] = '\0';
      local_128.__ss_padding[100] = '\0';
      local_128.__ss_padding[0x65] = '\0';
      local_128.__ss_padding[0x66] = '\0';
      local_128.__ss_padding[0x67] = '\0';
      local_128.__ss_padding[0x68] = '\0';
      local_128.__ss_padding[0x69] = '\0';
      local_128.__ss_padding[0x6a] = '\0';
      local_128.__ss_padding[0x6b] = '\0';
      local_128.__ss_padding[0x6c] = '\0';
      local_128.__ss_padding[0x6d] = '\0';
      local_128.__ss_padding[0x6e] = '\0';
      local_128.__ss_padding[0x6f] = '\0';
      local_128.__ss_padding[0x70] = '\0';
      local_128.__ss_padding[0x71] = '\0';
      local_128.__ss_padding[0x72] = '\0';
      local_128.__ss_padding[0x73] = '\0';
      local_128.__ss_padding[0x74] = '\0';
      local_128.__ss_padding[0x75] = '\0';
      local_128.__ss_align = 0;
      local_138 = 4;
      nn_ep_getopt((nn_ep *)self[1].shutdown_fn,0,0xe,&local_13c,&local_138);
      if (local_138 == 4) {
        pcVar3 = (char *)nn_chunkref_data((nn_chunkref *)&self[0x52].srcptr);
        addrlen_00 = nn_chunkref_size((nn_chunkref *)&self[0x52].srcptr);
        iVar2 = nn_iface_resolve(pcVar3,addrlen_00,local_13c,&local_128,&local_130);
        if (iVar2 < 0) goto LAB_00137ecc;
        ppvVar5 = &self[0x57].srcptr;
        psVar6 = local_a8;
        for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
          *(void **)psVar6 = *ppvVar5;
          ppvVar5 = ppvVar5 + (ulong)bVar8 * -2 + 1;
          psVar6 = (sockaddr *)(psVar6[-(ulong)bVar8].sa_data + 6);
        }
        if ((local_a8[0].sa_family | 8) != 10) goto LAB_00138010;
        uVar1 = (ushort)self[0x52].stopped.src;
        local_a8[0].sa_data._0_2_ = uVar1 << 8 | uVar1 >> 8;
        self_00 = &self[1].state;
        iVar2 = nn_usock_start((nn_usock *)self_00,(uint)local_a8[0].sa_family,1,0);
        if (iVar2 < 0) goto LAB_00137ecc;
        local_138 = 4;
        nn_ep_getopt((nn_ep *)self[1].shutdown_fn,0,2,local_140,&local_138);
        if (local_138 != 4) goto LAB_00137f9c;
        nn_usock_setsockopt((nn_usock *)self_00,1,7,local_140,4);
        local_138 = 4;
        nn_ep_getopt((nn_ep *)self[1].shutdown_fn,0,3,local_140,&local_138);
        if (local_138 == 4) {
          nn_usock_setsockopt((nn_usock *)self_00,1,8,local_140,4);
          iVar2 = nn_usock_bind((nn_usock *)self_00,(sockaddr *)&local_128,local_130);
          if (iVar2 == 0) {
            nn_usock_connect((nn_usock *)self_00,local_a8,(size_t)addrlen);
            *(undefined4 *)&self[1].fn = 4;
            nn_ep_stat_increment((nn_ep *)self[1].shutdown_fn,0xca,1);
            return;
          }
          goto LAB_00137ecc;
        }
      }
      else {
        nn_cws_handler_cold_15();
LAB_00137f9c:
        nn_cws_handler_cold_16();
      }
      nn_cws_handler_cold_17();
      goto LAB_00137fa6;
    }
    break;
  case 4:
    if (src != 1) goto LAB_00137fb0;
    if (type == 5) {
      pnVar7 = (nn_ep *)self[1].shutdown_fn;
      iVar2 = nn_usock_geterrno((nn_usock *)&self[1].state);
      nn_ep_set_error(pnVar7,iVar2);
      nn_usock_stop((nn_usock *)&self[1].state);
      *(undefined4 *)&self[1].fn = 7;
      nn_ep_stat_increment((nn_ep *)self[1].shutdown_fn,0xca,-1);
      pnVar7 = (nn_ep *)self[1].shutdown_fn;
      iVar2 = 0x69;
      goto LAB_00137f7d;
    }
    if (type == 1) {
      pcVar3 = (char *)nn_chunkref_data((nn_chunkref *)&self[0x51].stopped);
      host = (char *)nn_chunkref_data((nn_chunkref *)&self[0x51].stopped.item);
      nn_sws_start((nn_sws *)(self + 0xb),(nn_usock *)&self[1].state,1,pcVar3,host,
                   *(uint8_t *)&self[10].stopped.item.next);
      *(undefined4 *)&self[1].fn = 5;
      self[0x52].stopped.type = 0;
      nn_ep_stat_increment((nn_ep *)self[1].shutdown_fn,0xca,-1);
      nn_ep_stat_increment((nn_ep *)self[1].shutdown_fn,0x65,1);
      nn_ep_clear_error((nn_ep *)self[1].shutdown_fn);
      return;
    }
    goto LAB_00137ffb;
  case 5:
switchD_00137b2b_caseD_5:
    if (src != 4) {
LAB_00137fa6:
      nn_cws_handler_cold_9();
LAB_00137fab:
      nn_cws_handler_cold_13();
LAB_00137fb0:
      nn_cws_handler_cold_11();
LAB_00137fb5:
      nn_cws_handler_cold_3();
      goto LAB_00137fba;
    }
    if (type == 1) {
      nn_sws_stop((nn_sws *)(self + 0xb));
      *(undefined4 *)&self[1].fn = 6;
      pnVar7 = (nn_ep *)self[1].shutdown_fn;
      iVar2 = 0x68;
LAB_00137f7d:
      nn_ep_stat_increment(pnVar7,iVar2,1);
      return;
    }
    if (type == 2) {
      nn_sws_stop((nn_sws *)(self + 0xb));
      *(undefined4 *)&self[1].fn = 6;
      self[0x52].stopped.type = 1;
      return;
    }
    goto LAB_00137ff4;
  case 6:
    if (src != 4) goto LAB_00137fc4;
    if (type == 8) {
      return;
    }
    if (type == 3) {
      nn_usock_stop((nn_usock *)&self[1].state);
      *(undefined4 *)&self[1].fn = 7;
      return;
    }
    goto LAB_00138002;
  case 7:
    if (src != 1) goto LAB_00137fc9;
    if (type == 8) {
      return;
    }
    if (type == 7) {
      if (self[0x52].stopped.type != 0) {
        return;
      }
      goto LAB_00137ecc;
    }
    goto LAB_00138009;
  case 8:
    if (src != 2) goto LAB_00137fb5;
    if (type == 1) {
      nn_backoff_stop((nn_backoff *)&self[8].shutdown_fn);
      *(undefined4 *)&self[1].fn = 9;
      return;
    }
    goto LAB_00137fda;
  case 9:
    if (src != 2) goto LAB_00137fce;
    if (type == 2) goto LAB_00137f02;
    goto LAB_00137fe8;
  default:
    goto switchD_00137b2b_default;
  }
  nn_cws_handler_cold_14();
LAB_00137fda:
  nn_cws_handler_cold_4();
LAB_00137fe1:
  nn_cws_handler_cold_20();
LAB_00137fe8:
  nn_cws_handler_cold_2();
switchD_00137b2b_default:
  nn_cws_handler_cold_23();
LAB_00137ff4:
  nn_cws_handler_cold_10();
LAB_00137ffb:
  nn_cws_handler_cold_12();
LAB_00138002:
  nn_cws_handler_cold_8();
LAB_00138009:
  nn_cws_handler_cold_6();
LAB_00138010:
  nn_cws_handler_cold_18();
}

Assistant:

static void nn_cws_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_cws *cws;

    cws = nn_cont (self, struct nn_cws, fsm);

    switch (cws->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/*  The state machine wasn't yet started.                                     */
/******************************************************************************/
    case NN_CWS_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_cws_start_resolving (cws);
                return;
            default:
                nn_fsm_bad_action (cws->state, src, type);
            }

        default:
            nn_fsm_bad_source (cws->state, src, type);
        }

/******************************************************************************/
/*  RESOLVING state.                                                          */
/*  Name of the host to connect to is being resolved to get an IP address.    */
/******************************************************************************/
    case NN_CWS_STATE_RESOLVING:
        switch (src) {

        case NN_CWS_SRC_DNS:
            switch (type) {
            case NN_DNS_DONE:
                nn_dns_stop (&cws->dns);
                cws->state = NN_CWS_STATE_STOPPING_DNS;
                return;
            default:
                nn_fsm_bad_action (cws->state, src, type);
            }

        default:
            nn_fsm_bad_source (cws->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_DNS state.                                                       */
/*  dns object was asked to stop but it haven't stopped yet.                  */
/******************************************************************************/
    case NN_CWS_STATE_STOPPING_DNS:
        switch (src) {

        case NN_CWS_SRC_DNS:
            switch (type) {
            case NN_DNS_STOPPED:
                if (cws->dns_result.error == 0) {
                    nn_cws_start_connecting (cws, &cws->dns_result.addr,
                        cws->dns_result.addrlen);
                    return;
                }
                nn_backoff_start (&cws->retry);
                cws->state = NN_CWS_STATE_WAITING;
                return;
            default:
                nn_fsm_bad_action (cws->state, src, type);
            }

        default:
            nn_fsm_bad_source (cws->state, src, type);
        }

/******************************************************************************/
/*  CONNECTING state.                                                         */
/*  Non-blocking connect is under way.                                        */
/******************************************************************************/
    case NN_CWS_STATE_CONNECTING:
        switch (src) {

        case NN_CWS_SRC_USOCK:
            switch (type) {
            case NN_USOCK_CONNECTED:
                nn_sws_start (&cws->sws, &cws->usock, NN_WS_CLIENT,
                    nn_chunkref_data (&cws->resource),
                    nn_chunkref_data (&cws->remote_host), cws->msg_type);
                cws->state = NN_CWS_STATE_ACTIVE;
                cws->peer_gone = 0;
                nn_ep_stat_increment (cws->ep,
                    NN_STAT_INPROGRESS_CONNECTIONS, -1);
                nn_ep_stat_increment (cws->ep,
                    NN_STAT_ESTABLISHED_CONNECTIONS, 1);
                nn_ep_clear_error (cws->ep);
                return;
            case NN_USOCK_ERROR:
                nn_ep_set_error (cws->ep, nn_usock_geterrno (&cws->usock));
                nn_usock_stop (&cws->usock);
                cws->state = NN_CWS_STATE_STOPPING_USOCK;
                nn_ep_stat_increment (cws->ep,
                    NN_STAT_INPROGRESS_CONNECTIONS, -1);
                nn_ep_stat_increment (cws->ep, NN_STAT_CONNECT_ERRORS, 1);
                return;
            default:
                nn_fsm_bad_action (cws->state, src, type);
            }

        default:
            nn_fsm_bad_source (cws->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/*  Connection is established and handled by the sws state machine.           */
/******************************************************************************/
    case NN_CWS_STATE_ACTIVE:
        switch (src) {

        case NN_CWS_SRC_SWS:
            switch (type) {
            case NN_SWS_RETURN_CLOSE_HANDSHAKE:
                /*  Peer closed connection without intention to reconnect, or
                    local endpoint failed remote because of invalid data. */
                nn_sws_stop (&cws->sws);
                cws->state = NN_CWS_STATE_STOPPING_SWS;
                cws->peer_gone = 1;
                return;
            case NN_SWS_RETURN_ERROR:
                nn_sws_stop (&cws->sws);
                cws->state = NN_CWS_STATE_STOPPING_SWS;
                nn_ep_stat_increment (cws->ep, NN_STAT_BROKEN_CONNECTIONS, 1);
                return;
            default:
                nn_fsm_bad_action (cws->state, src, type);
            }

        default:
            nn_fsm_bad_source (cws->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_SWS state.                                                       */
/*  sws object was asked to stop but it haven't stopped yet.                  */
/******************************************************************************/
    case NN_CWS_STATE_STOPPING_SWS:
        switch (src) {

        case NN_CWS_SRC_SWS:
            switch (type) {
            case NN_USOCK_SHUTDOWN:
                return;
            case NN_SWS_RETURN_STOPPED:
                nn_usock_stop (&cws->usock);
                cws->state = NN_CWS_STATE_STOPPING_USOCK;
                return;
            default:
                nn_fsm_bad_action (cws->state, src, type);
            }

        default:
            nn_fsm_bad_source (cws->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_USOCK state.                                                     */
/*  usock object was asked to stop but it haven't stopped yet.                */
/******************************************************************************/
    case NN_CWS_STATE_STOPPING_USOCK:
        switch (src) {

        case NN_CWS_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SHUTDOWN:
                return;
            case NN_USOCK_STOPPED:
                /*  If the peer has confirmed itself gone with a Closing
                    Handshake, or if the local endpoint failed the remote,
                    don't try to reconnect. */
                if (!cws->peer_gone) {
                    nn_backoff_start (&cws->retry);
                    cws->state = NN_CWS_STATE_WAITING;
                }
                return;
            default:
                nn_fsm_bad_action (cws->state, src, type);
            }

        default:
            nn_fsm_bad_source (cws->state, src, type);
        }

/******************************************************************************/
/*  WAITING state.                                                            */
/*  Waiting before re-connection is attempted. This way we won't overload     */
/*  the system by continuous re-connection attemps.                           */
/******************************************************************************/
    case NN_CWS_STATE_WAITING:
        switch (src) {

        case NN_CWS_SRC_RECONNECT_TIMER:
            switch (type) {
            case NN_BACKOFF_TIMEOUT:
                nn_backoff_stop (&cws->retry);
                cws->state = NN_CWS_STATE_STOPPING_BACKOFF;
                return;
            default:
                nn_fsm_bad_action (cws->state, src, type);
            }

        default:
            nn_fsm_bad_source (cws->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_BACKOFF state.                                                   */
/*  backoff object was asked to stop, but it haven't stopped yet.             */
/******************************************************************************/
    case NN_CWS_STATE_STOPPING_BACKOFF:
        switch (src) {

        case NN_CWS_SRC_RECONNECT_TIMER:
            switch (type) {
            case NN_BACKOFF_STOPPED:
                nn_cws_start_resolving (cws);
                return;
            default:
                nn_fsm_bad_action (cws->state, src, type);
            }

        default:
            nn_fsm_bad_source (cws->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (cws->state, src, type);
    }
}